

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCheck.c
# Opt level: O0

void Aig_ManCheckMarkA(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_1c) {
      return;
    }
    pvVar2 = Vec_PtrEntry(p->vObjs,local_1c);
    if ((pvVar2 != (void *)0x0) && ((*(ulong *)((long)pvVar2 + 0x18) >> 4 & 1) != 0)) break;
    local_1c = local_1c + 1;
  }
  __assert_fail("pObj->fMarkA == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCheck.c"
                ,0x89,"void Aig_ManCheckMarkA(Aig_Man_t *)");
}

Assistant:

void Aig_ManCheckMarkA( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        assert( pObj->fMarkA == 0 );
}